

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleProtectedDirective
          (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *__return_storage_ptr__,
          Preprocessor *this,Token directive)

{
  int iVar1;
  SourceLocation location;
  undefined4 extraout_var;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  Trivia TVar2;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  Trivia skippedTrivia;
  anon_union_12_4_39e54f29_for_Trivia_0 local_98;
  Token token;
  SmallVector<slang::parsing::Token,_4UL> skipped;
  
  ctx = directive._0_8_;
  skipped.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)skipped.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  skipped.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  skipped.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
  skipMacroTokensBeforeProtectRegion
            (this,directive,&skipped.super_SmallVectorBase<slang::parsing::Token>);
  token = Lexer::lexEncodedText
                    ((Lexer *)(this->lexerStack).
                              super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                              .data_[(this->lexerStack).
                                     super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                     .len - 1]._M_t.
                              super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                              .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>,Raw,0,false,
                     true);
  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
            (&skipped.super_SmallVectorBase<slang::parsing::Token>,&token);
  location = Token::location(&token);
  addDiag(this,(DiagCode)0x280004,location);
  Trivia::Trivia(&skippedTrivia);
  if (skipped.super_SmallVectorBase<slang::parsing::Token>.len != 0) {
    iVar1 = SmallVectorBase<slang::parsing::Token>::copy
                      (&skipped.super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    tokens._M_ptr._4_4_ = extraout_var;
    tokens._M_ptr._0_4_ = iVar1;
    tokens._M_extent._M_extent_value = extraout_RDX._M_extent_value;
    Trivia::Trivia((Trivia *)&local_98.rawText,SkippedTokens,tokens);
    skippedTrivia._8_6_ = stack0xffffffffffffff70;
    skippedTrivia.field_0._0_6_ = local_98._0_6_;
    skippedTrivia.field_0._6_2_ = local_98._6_2_;
  }
  TVar2 = createSimpleDirective(this,directive);
  (__return_storage_ptr__->first).field_0.rawText.ptr = TVar2.field_0._0_8_;
  (__return_storage_ptr__->first).field_0.rawText.len = TVar2.field_0._8_4_;
  (__return_storage_ptr__->first).hasFullLocation = (bool)(char)TVar2._12_2_;
  (__return_storage_ptr__->first).kind = (char)((ushort)TVar2._12_2_ >> 8);
  (__return_storage_ptr__->second).field_0.rawText.ptr =
       (char *)CONCAT26(skippedTrivia.field_0._6_2_,skippedTrivia.field_0._0_6_);
  *(ulong *)((long)&(__return_storage_ptr__->second).field_0 + 8) =
       CONCAT26(skippedTrivia._14_2_,skippedTrivia._8_6_);
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&skipped.super_SmallVectorBase<slang::parsing::Token>,ctx);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handleProtectedDirective(Token directive) {
    // This is handling legacy Verilog-XL style `protected directives.
    SmallVector<Token, 4> skipped;
    skipMacroTokensBeforeProtectRegion(directive, skipped);

    Token token = lexerStack.back()->lexEncodedText(ProtectEncoding::Raw, 0,
                                                    /* isSingleLine */ false,
                                                    /* legacyProtectedMode */ true);
    skipped.push_back(token);

    addDiag(diag::ProtectedEnvelope, token.location());

    Trivia skippedTrivia;
    if (!skipped.empty())
        skippedTrivia = Trivia(TriviaKind::SkippedTokens, skipped.copy(alloc));

    return {createSimpleDirective(directive), skippedTrivia};
}